

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O3

void __thiscall
cppnet::TimerContainer::TimerContainer
          (TimerContainer *this,shared_ptr<cppnet::TimerContainer> *sub_timer,TIME_UNIT unit,
          TIME_UNIT max)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Timer)._vptr_Timer = (_func_int **)&PTR_AddTimer_00125ab0;
  this->_time_unit = unit;
  this->_size = max / unit;
  this->_timer_max = max;
  this->_cur_time = 0;
  Bitmap::Bitmap(&this->_bitmap);
  (this->_root_timer).super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_root_timer).super___weak_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sub_timer->super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (sub_timer->super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_timer_wheel)._M_h._M_buckets = &(this->_timer_wheel)._M_h._M_single_bucket;
  (this->_timer_wheel)._M_h._M_bucket_count = 1;
  (this->_timer_wheel)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_timer_wheel)._M_h._M_element_count = 0;
  (this->_timer_wheel)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_timer_wheel)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_timer_wheel)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Bitmap::Init(&this->_bitmap,this->_size);
  return;
}

Assistant:

TimerContainer::TimerContainer(std::shared_ptr<TimerContainer> sub_timer, TIME_UNIT unit, TIME_UNIT max):
    _time_unit(unit),
    _size(max / unit),
    _timer_max(max),
    _cur_time(0),
    _sub_timer(sub_timer) {

    _bitmap.Init(_size);
}